

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O2

uint32_t __thiscall
basisu::bitwise_coder::put_vlc(bitwise_coder *this,uint32_t v,uint32_t chunk_bits)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  
  if (chunk_bits != 0) {
    uVar4 = 1 << ((byte)chunk_bits & 0x1f);
    uVar5 = 0;
    do {
      bVar1 = (byte)chunk_bits & 0x1f;
      uVar2 = uVar4;
      if (v >> bVar1 == 0) {
        uVar2 = v >> bVar1;
      }
      uVar3 = put_bits(this,uVar2 | v & uVar4 - 1,chunk_bits + 1);
      uVar5 = uVar5 + uVar3;
      uVar2 = v >> bVar1;
      v = v >> bVar1;
    } while (uVar2 != 0);
    return uVar5;
  }
  __assert_fail("chunk_bits",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                ,0x97a,"uint32_t basisu::bitwise_coder::put_vlc(uint32_t, uint32_t)");
}

Assistant:

inline uint32_t put_vlc(uint32_t v, uint32_t chunk_bits)
		{
			assert(chunk_bits);

			const uint32_t chunk_size = 1 << chunk_bits;
			const uint32_t chunk_mask = chunk_size - 1;
					
			uint32_t total_bits = 0;

			for ( ; ; )
			{
				uint32_t next_v = v >> chunk_bits;
								
				total_bits += put_bits((v & chunk_mask) | (next_v ? chunk_size : 0), chunk_bits + 1);
				if (!next_v)
					break;

				v = next_v;
			}

			return total_bits;
		}